

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eternal.hpp
# Opt level: O2

element_hash<mapbox::eternal::string,_unsigned_int,_std::hash<mapbox::eternal::string>_> *
mapbox::eternal::impl::
bound<mapbox::eternal::impl::less,mapbox::eternal::impl::element_hash<mapbox::eternal::string,unsigned_int,std::hash<mapbox::eternal::string>>const*,mapbox::eternal::impl::compare_key_hash<mapbox::eternal::string,std::hash<mapbox::eternal::string>>>
          (element_hash<mapbox::eternal::string,_unsigned_int,_std::hash<mapbox::eternal::string>_>
           *left,element_hash<mapbox::eternal::string,_unsigned_int,_std::hash<mapbox::eternal::string>_>
                 *right,
          compare_key_hash<mapbox::eternal::string,_std::hash<mapbox::eternal::string>_> *key)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = ((long)right - (long)left) / 0x18;
  while (uVar3 = uVar2, uVar3 != 0) {
    uVar2 = uVar3 >> 1;
    bVar1 = element_hash<mapbox::eternal::string,unsigned_int,std::hash<mapbox::eternal::string>>::
            operator<((element_hash<mapbox::eternal::string,unsigned_int,std::hash<mapbox::eternal::string>>
                       *)(left + uVar2),key);
    if (bVar1) {
      left = left + uVar2 + 1;
      uVar2 = ~uVar2 + uVar3;
    }
  }
  return left;
}

Assistant:

MAPBOX_ETERNAL_CONSTEXPR auto bound(Iterator left, Iterator right, const Key& key) noexcept {
    std::size_t count = std::size_t(right - left);
    while (count > 0) {
        const std::size_t step = count / 2;
        right = left + step;
        if (Compare()(*right, key)) {
            left = ++right;
            count -= step + 1;
        } else {
            count = step;
        }
    }
    return left;
}